

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Sign GEO::PCK::in_circle_3dlifted_SOS
               (double *p0,double *p1,double *p2,double *p3,double h0,double h1,double h2,double h3,
               bool SOS)

{
  Sign SVar1;
  bool SOS_local;
  double h3_local;
  double h2_local;
  double h1_local;
  double h0_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  SVar1 = side3_3dlifted_SOS(p0,p1,p2,p3,h0,h1,h2,h3,p0,p1,p2,SOS);
  return -SVar1;
}

Assistant:

Sign GEOGRAM_API in_circle_3dlifted_SOS(
            const double* p0, const double* p1, const double* p2,
            const double* p3,
            double h0, double h1, double h2, double h3,
	    bool SOS
        ) {
            // in_circle_3dlifted is simply implemented using side3_3dlifted.
            // Both predicates are equivalent through duality
            // (see comment in in_circle_3d_SOS(), the same
            //  remark applies).
            return Sign(
		-side3_3dlifted_SOS(p0,p1,p2,p3,h0,h1,h2,h3,p0,p1,p2,SOS)
	    );
        }